

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLimit::SetMax(ChLinkLimit *this,double val)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  this->m_max = val;
  dVar3 = this->m_min;
  if (val < this->m_min) {
    this->m_min = val;
    dVar3 = val;
  }
  dVar1 = val - dVar3;
  dVar2 = val - this->m_maxCushion;
  dVar4 = this->m_maxCushion;
  if (dVar2 < dVar3) {
    dVar2 = val - dVar1;
    this->m_maxCushion = dVar1;
    dVar4 = dVar1;
  }
  if (dVar2 < dVar3 + this->m_minCushion) {
    this->m_minCushion = dVar1 - dVar4;
  }
  (this->constr_upper).super_ChConstraintTwo.super_ChConstraint.active = true;
  return;
}

Assistant:

void ChLinkLimit::SetMax(double val) {
    m_max = val;
    if (m_max < m_min)
        m_min = m_max;
    if (m_max - m_maxCushion < m_min)
        m_maxCushion = m_max - m_min;
    if (m_max - m_maxCushion < m_min + m_minCushion)
        m_minCushion = m_max - m_min - m_maxCushion;
    constr_upper.SetActive(true);
}